

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O2

kbool_t LoadPlatformModule(KonohaFactory *factory,char *moduleName,ModuleType type)

{
  kbool_t kVar1;
  undefined1 uVar2;
  char *pcVar3;
  long lVar4;
  code *pcVar5;
  char *pcVar6;
  char funcbuf [256];
  char pathbuf [4096];
  
  pcVar3 = (*factory->getenv_i)("KONOHA_HOME");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (*factory->getenv_i)("HOME");
    pcVar6 = "/.konoha/module";
  }
  else {
    pcVar6 = "/module";
  }
  snprintf(pathbuf,0x1000,"%s%s/%s/%s%s",pcVar3,pcVar6,moduleName,moduleName,".so");
  kVar1 = HasFile(pathbuf);
  if (!kVar1) {
    snprintf(pathbuf,0x1000,"/usr/local/lib/konoha/3.0/module/%s/%s%s",moduleName,moduleName,".so");
  }
  kVar1 = HasFile(pathbuf);
  if ((kVar1) && (lVar4 = dlopen(pathbuf,1), lVar4 != 0)) {
    snprintf(funcbuf,0x100,"Load%sModule",moduleName);
    pcVar5 = (code *)dlsym(lVar4,funcbuf);
    if (pcVar5 != (code *)0x0) {
      uVar2 = (*pcVar5)(factory,type);
      return (kbool_t)uVar2;
    }
  }
  return false;
}

Assistant:

static kbool_t LoadPlatformModule(KonohaFactory *factory, const char *moduleName, ModuleType type)
{
	char pathbuf[K_PATHMAX];
	if(FormatModulePath(factory, pathbuf, sizeof(pathbuf), moduleName, K_OSDLLEXT)) {
		void *gluehdr = dlopen(pathbuf, RTLD_LAZY);  // don't close until the program ends
		if(gluehdr != NULL) {
			char funcbuf[256];
			snprintf(funcbuf, sizeof(funcbuf), "Load%sModule", moduleName);
			ModuleLoadFunc load = (ModuleLoadFunc)dlsym(gluehdr, funcbuf);
			if(load != NULL) {
				return load(factory, type);
			}
		}
	}
	return false;
}